

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarLinux.cpp
# Opt level: O0

bool tools::xar::fuse_allows_visible_mounts(string *fuse_conf_path)

{
  bool bVar1;
  istream *piVar2;
  undefined1 local_240 [8];
  string line;
  ifstream input;
  string *fuse_conf_path_local;
  
  std::ifstream::ifstream((undefined1 *)((long)&line.field_2 + 8),fuse_conf_path,8);
  std::__cxx11::string::string((string *)local_240);
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(line.field_2._M_local_buf + 8),(string *)local_240);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) {
      fuse_conf_path_local._7_1_ = false;
      goto LAB_00110d2b;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_240,"user_allow_other");
  } while (!bVar1);
  fuse_conf_path_local._7_1_ = true;
LAB_00110d2b:
  std::__cxx11::string::~string((string *)local_240);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  return fuse_conf_path_local._7_1_;
}

Assistant:

bool tools::xar::fuse_allows_visible_mounts(std::string fuse_conf_path) {
  std::ifstream input(fuse_conf_path);

  std::string line;
  while (std::getline(input, line)) {
    if (line == "user_allow_other") {
      return true;
    }
  }

  return false;
}